

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldriver.cpp
# Opt level: O1

QString * __thiscall
QSqlDriver::stripDelimiters
          (QString *__return_storage_ptr__,QSqlDriver *this,QString *identifier,IdentifierType type)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  long in_FS_OFFSET;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  cVar4 = (**(code **)(*(long *)this + 0xf0))(this,identifier,type);
  if (cVar4 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QString::operator=(__return_storage_ptr__,identifier);
      return __return_storage_ptr__;
    }
  }
  else {
    QString::mid((longlong)&local_38,(longlong)identifier);
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_38;
    (__return_storage_ptr__->d).ptr = pcStack_30;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_28;
    local_38 = pQVar1;
    pcStack_30 = pcVar2;
    local_28 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    QString::chop((longlong)__return_storage_ptr__);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlDriver::stripDelimiters(const QString &identifier, IdentifierType type) const
{
    QString ret;
    if (isIdentifierEscaped(identifier, type)) {
        ret = identifier.mid(1);
        ret.chop(1);
    } else {
        ret = identifier;
    }
    return ret;
}